

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O2

void __thiscall libtorrent::aux::posix_storage::posix_storage(posix_storage *this,storage_params *p)

{
  undefined8 __p;
  difference_type in_RCX;
  span<const_char> in;
  undefined1 local_70 [32];
  string local_50;
  
  this->m_files = p->files;
  (this->m_mapped_files)._M_t.
  super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>.
  _M_t.
  super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
  .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl = (file_storage *)0x0;
  ::std::__cxx11::string::string((string *)&this->m_save_path,(string *)p->path);
  stat_cache::stat_cache(&this->m_stat_cache);
  ::std::
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  ::vector(&(this->m_file_priority).
            super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
           ,&p->priorities->
             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          );
  (this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->m_use_partfile).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  in.m_len = in_RCX;
  in.m_ptr = (char *)0x14;
  to_hex_abi_cxx11_((string *)(local_70 + 0x20),(aux *)&p->info_hash,in);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,"."
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_70 + 0x20));
  ::std::operator+(&this->m_part_file_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   ".parts");
  ::std::__cxx11::string::~string((string *)local_70);
  ::std::__cxx11::string::~string((string *)(local_70 + 0x20));
  (this->m_part_file)._M_t.
  super___uniq_ptr_impl<libtorrent::aux::posix_part_file,_std::default_delete<libtorrent::aux::posix_part_file>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::posix_part_file_*,_std::default_delete<libtorrent::aux::posix_part_file>_>
  .super__Head_base<0UL,_libtorrent::aux::posix_part_file_*,_false>._M_head_impl =
       (posix_part_file *)0x0;
  if (p->mapped_files != (file_storage *)0x0) {
    ::std::make_unique<libtorrent::file_storage,libtorrent::file_storage_const&>
              ((file_storage *)local_70);
    __p = local_70._0_8_;
    local_70._0_8_ = (pointer)0x0;
    ::std::__uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
    ::reset((__uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
             *)&this->m_mapped_files,(pointer)__p);
    ::std::unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>::
    ~unique_ptr((unique_ptr<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                 *)local_70);
  }
  return;
}

Assistant:

posix_storage::posix_storage(storage_params const& p)
		: m_files(p.files)
		, m_save_path(p.path)
		, m_file_priority(p.priorities)
		, m_part_file_name("." + to_hex(p.info_hash) + ".parts")
	{
		if (p.mapped_files) m_mapped_files = std::make_unique<file_storage>(*p.mapped_files);
	}